

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined8 tolerance_00;
  int iVar2;
  int iVar3;
  reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  bool quickPath_00;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_3f4;
  undefined1 auStack_3f0 [4];
  int i_3;
  TestNormsData testnorms_data;
  double optTolerance;
  int numberOfCgSets;
  double total_runtime;
  double current_time;
  double last_cummulative_time;
  int i_2;
  undefined1 local_398 [8];
  vector<double,_std::allocator<double>_> opt_times;
  double opt_worst_time;
  int optNiters;
  int optMaxIters;
  int tolerance_failures;
  TestSymmetryData testsymmetry_data;
  TestCGData testcg_data;
  double t7;
  double refTolerance;
  int i_1;
  int err_count;
  double tolerance;
  value_type_conflict local_308;
  undefined1 local_300 [8];
  vector<double,_std::allocator<double>_> ref_times;
  double dStack_2e0;
  int refMaxIters;
  double normr0;
  double normr;
  int totalNiters_ref;
  int niters;
  int global_failure;
  int i;
  double t_begin;
  undefined1 local_2b0 [4];
  int numberOfCalls;
  Vector b_computed;
  Vector x_overlap;
  local_int_t ncol;
  local_int_t nrow;
  CGData data;
  Vector *pVStack_210;
  int level_1;
  Vector *curxexact;
  Vector *curx;
  Vector *curb;
  SparseMatrix_STRUCT *pSStack_1f0;
  int level;
  SparseMatrix *curLevelMatrix;
  undefined1 local_1e0 [4];
  int numberOfMgLevels;
  Vector xexact;
  Vector x;
  Vector b;
  SparseMatrix A;
  double setup_time;
  allocator<double> local_b1;
  value_type_conflict local_b0;
  undefined1 local_a8 [8];
  vector<double,_std::allocator<double>_> times;
  Geometry *geom;
  int ierr;
  local_int_t nz;
  local_int_t ny;
  local_int_t nx;
  int rank;
  int size;
  int iStack_68;
  bool quickPath;
  HPCG_Params params;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  params._44_8_ = argv;
  argv_local._0_4_ = argc;
  HPCG_Init((int *)&argv_local,(char ***)&params.zl,(HPCG_Params *)&size);
  quickPath_00 = params.ny == 0;
  iVar2 = CheckAspectRatio(0.125,params.comm_rank,params.numThreads,params.nx,"local problem",
                           iStack_68 == 0);
  if (iVar2 == 0) {
    times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)operator_new(0x80);
    GenerateGeometry(size,iStack_68,params.comm_size,params.npy,params.npz,params.pz,
                     params.comm_rank,params.numThreads,params.nx,params.nz,params.runningTime,
                     params.npx,
                     (Geometry *)
                     times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    iVar2 = CheckAspectRatio(0.125,*(int *)(times.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                             *(int *)((long)times.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0x1c
                                     ),
                             *(int *)(times.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                             "process grid",iStack_68 == 0);
    if (iVar2 == 0) {
      local_b0 = 0.0;
      std::allocator<double>::allocator(&local_b1);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_a8,10,&local_b0,&local_b1);
      std::allocator<double>::~allocator(&local_b1);
      dVar7 = mytimer();
      SparseMatrix_STRUCT::SparseMatrix_STRUCT((SparseMatrix_STRUCT *)&b.optimizationData);
      InitializeSparseMatrix
                ((SparseMatrix *)&b.optimizationData,
                 (Geometry *)
                 times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      GenerateProblem((SparseMatrix *)&b.optimizationData,(Vector *)&x.optimizationData,
                      (Vector *)&xexact.optimizationData,(Vector *)local_1e0);
      SetupHalo((SparseMatrix *)&b.optimizationData);
      pSStack_1f0 = (SparseMatrix_STRUCT *)&b.optimizationData;
      for (curb._4_4_ = 1; curb._4_4_ < 4; curb._4_4_ = curb._4_4_ + 1) {
        GenerateCoarseProblem(pSStack_1f0);
        pSStack_1f0 = pSStack_1f0->Ac;
      }
      dVar8 = mytimer();
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,9);
      *pvVar4 = dVar8 - dVar7;
      pSStack_1f0 = (SparseMatrix_STRUCT *)&b.optimizationData;
      curx = (Vector *)&x.optimizationData;
      curxexact = (Vector *)&xexact.optimizationData;
      pVStack_210 = (Vector *)local_1e0;
      for (data.Ap.optimizationData._4_4_ = 0; data.Ap.optimizationData._4_4_ < 4;
          data.Ap.optimizationData._4_4_ = data.Ap.optimizationData._4_4_ + 1) {
        CheckProblem(pSStack_1f0,curx,curxexact,pVStack_210);
        pSStack_1f0 = pSStack_1f0->Ac;
        curx = (Vector *)0x0;
        curxexact = (Vector *)0x0;
        pVStack_210 = (Vector *)0x0;
      }
      InitializeSparseCGData((SparseMatrix *)&b.optimizationData,(CGData *)&ncol);
      InitializeVector((Vector *)&b_computed.optimizationData,A.totalNumberOfNonzeros._4_4_);
      InitializeVector((Vector *)local_2b0,(local_int_t)A.totalNumberOfNonzeros);
      FillRandomVector((Vector *)&b_computed.optimizationData);
      t_begin._4_4_ = 10;
      if (quickPath_00) {
        t_begin._4_4_ = 1;
      }
      _global_failure = mytimer();
      for (niters = 0; niters < t_begin._4_4_; niters = niters + 1) {
        iVar2 = ComputeSPMV_ref((SparseMatrix *)&b.optimizationData,
                                (Vector *)&b_computed.optimizationData,(Vector *)local_2b0);
        if (iVar2 != 0) {
          poVar5 = std::operator<<((ostream *)HPCG_fout,"Error in call to SpMV: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5,".\n");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        iVar2 = ComputeMG_ref((SparseMatrix *)&b.optimizationData,(Vector *)local_2b0,
                              (Vector *)&b_computed.optimizationData);
        if (iVar2 != 0) {
          poVar5 = std::operator<<((ostream *)HPCG_fout,"Error in call to MG: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5,".\n");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
      }
      dVar7 = mytimer();
      dVar7 = dVar7 - _global_failure;
      dVar8 = (double)t_begin._4_4_;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,8);
      *pvVar4 = dVar7 / dVar8;
      totalNiters_ref = 0;
      normr._4_4_ = 0;
      normr._0_4_ = 0;
      normr0 = 0.0;
      dStack_2e0 = 0.0;
      ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0x32;
      t_begin._4_4_ = 1;
      local_308 = 0.0;
      std::allocator<double>::allocator((allocator<double> *)((long)&tolerance + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_300,9,&local_308,
                 (allocator<double> *)((long)&tolerance + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&tolerance + 7));
      refTolerance._4_4_ = 0;
      for (refTolerance._0_4_ = 0; refTolerance._0_4_ < t_begin._4_4_;
          refTolerance._0_4_ = refTolerance._0_4_ + 1) {
        ZeroVector((Vector *)&xexact.optimizationData);
        iVar2 = ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_300,0);
        iVar2 = CG_ref((SparseMatrix *)&b.optimizationData,(CGData *)&ncol,
                       (Vector *)&x.optimizationData,(Vector *)&xexact.optimizationData,iVar2,0.0,
                       (int *)((long)&normr + 4),&normr0,&stack0xfffffffffffffd20,pvVar4,true);
        if (iVar2 != 0) {
          refTolerance._4_4_ = refTolerance._4_4_ + 1;
        }
        normr._0_4_ = normr._4_4_ + normr._0_4_;
      }
      if ((iStack_68 == 0) && (refTolerance._4_4_ != 0)) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)HPCG_fout,refTolerance._4_4_);
        poVar5 = std::operator<<(poVar5," error(s) in call(s) to reference CG.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      dVar7 = normr0 / dStack_2e0;
      dVar8 = mytimer();
      OptimizeProblem((SparseMatrix *)&b.optimizationData,(CGData *)&ncol,
                      (Vector *)&x.optimizationData,(Vector *)&xexact.optimizationData,
                      (Vector *)local_1e0);
      dVar9 = mytimer();
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,7);
      *pvVar4 = dVar9 - dVar8;
      testsymmetry_data._20_4_ = 0;
      testsymmetry_data.count_fail = 0;
      TestCG((SparseMatrix *)&b.optimizationData,(CGData *)&ncol,(Vector *)&x.optimizationData,
             (Vector *)&xexact.optimizationData,(TestCGData *)&testsymmetry_data.count_fail);
      TestSymmetry((SparseMatrix *)&b.optimizationData,(Vector *)&x.optimizationData,
                   (Vector *)local_1e0,(TestSymmetryData *)&optMaxIters);
      normr._4_4_ = 0;
      normr0 = 0.0;
      dStack_2e0 = 0.0;
      refTolerance._4_4_ = 0;
      optNiters = 0;
      iVar2 = ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ * 10;
      opt_worst_time._4_4_ =
           ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      _i_2 = 0.0;
      std::allocator<double>::allocator((allocator<double> *)((long)&last_cummulative_time + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_398,9,(value_type_conflict *)&i_2,
                 (allocator<double> *)((long)&last_cummulative_time + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&last_cummulative_time + 7));
      for (last_cummulative_time._0_4_ = 0; last_cummulative_time._0_4_ < t_begin._4_4_;
          last_cummulative_time._0_4_ = last_cummulative_time._0_4_ + 1) {
        ZeroVector((Vector *)&xexact.optimizationData);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_398,0);
        dVar8 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_398,0);
        iVar3 = CG((SparseMatrix *)&b.optimizationData,(CGData *)&ncol,(Vector *)&x.optimizationData
                   ,(Vector *)&xexact.optimizationData,iVar2,dVar7,(int *)((long)&normr + 4),&normr0
                   ,&stack0xfffffffffffffd20,pvVar4,true);
        if (iVar3 != 0) {
          refTolerance._4_4_ = refTolerance._4_4_ + 1;
        }
        if (dVar7 * 1.000001 < normr0 / dStack_2e0) {
          optNiters = optNiters + 1;
        }
        if (opt_worst_time._4_4_ < normr._4_4_) {
          opt_worst_time._4_4_ = normr._4_4_;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_398,0);
        if ((double)opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage < *pvVar4 - dVar8) {
          opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)(*pvVar4 - dVar8);
        }
      }
      if ((iStack_68 == 0) && (refTolerance._4_4_ != 0)) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)HPCG_fout,refTolerance._4_4_);
        poVar5 = std::operator<<(poVar5," error(s) in call(s) to optimized CG.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      if ((optNiters != 0) && (totalNiters_ref = 1, iStack_68 == 0)) {
        poVar5 = std::operator<<((ostream *)HPCG_fout,"Failed to reduce the residual ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,optNiters);
        poVar5 = std::operator<<(poVar5," times.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      iVar2 = (int)((double)params.ny /
                   (double)opt_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage) + 1;
      testnorms_data.samples = 0;
      testnorms_data.pass = false;
      testnorms_data._29_3_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar2;
      uVar6 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      testnorms_data.variance._0_4_ = iVar2;
      _auStack_3f0 = (double *)operator_new__(uVar6);
      for (local_3f4 = 0; local_3f4 < iVar2; local_3f4 = local_3f4 + 1) {
        ZeroVector((Vector *)&xexact.optimizationData);
        tolerance_00 = testnorms_data._24_8_;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_a8,0);
        iVar3 = CG((SparseMatrix *)&b.optimizationData,(CGData *)&ncol,(Vector *)&x.optimizationData
                   ,(Vector *)&xexact.optimizationData,opt_worst_time._4_4_,(double)tolerance_00,
                   (int *)((long)&normr + 4),&normr0,&stack0xfffffffffffffd20,pvVar4,true);
        if (iVar3 != 0) {
          poVar5 = std::operator<<((ostream *)HPCG_fout,"Error in call to CG: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          poVar5 = std::operator<<(poVar5,".\n");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        if (iStack_68 == 0) {
          poVar5 = std::operator<<((ostream *)HPCG_fout,"Call [");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3f4);
          poVar5 = std::operator<<(poVar5,"] Scaled Residual [");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,normr0 / dStack_2e0);
          poVar5 = std::operator<<(poVar5,"]");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        _auStack_3f0[local_3f4] = normr0 / dStack_2e0;
      }
      TestNorms((TestNormsData *)auStack_3f0);
      iVar3 = ref_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_a8,0);
      ReportResults((SparseMatrix *)&b.optimizationData,4,iVar2,iVar3,opt_worst_time._4_4_,pvVar4,
                    (TestCGData *)&testsymmetry_data.count_fail,(TestSymmetryData *)&optMaxIters,
                    (TestNormsData *)auStack_3f0,totalNiters_ref,quickPath_00);
      DeleteMatrix((SparseMatrix *)&b.optimizationData);
      DeleteCGData((CGData *)&ncol);
      DeleteVector((Vector *)&xexact.optimizationData);
      DeleteVector((Vector *)&x.optimizationData);
      DeleteVector((Vector *)local_1e0);
      DeleteVector((Vector *)&b_computed.optimizationData);
      DeleteVector((Vector *)local_2b0);
      if (_auStack_3f0 != (double *)0x0) {
        operator_delete__(_auStack_3f0);
      }
      HPCG_Finalize();
      argv_local._4_4_ = 0;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_398);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_300);
      SparseMatrix_STRUCT::~SparseMatrix_STRUCT((SparseMatrix_STRUCT *)&b.optimizationData);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_a8);
      iVar2 = argv_local._4_4_;
    }
  }
  argv_local._4_4_ = iVar2;
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * argv[]) {

#ifndef HPCG_NO_MPI
  MPI_Init(&argc, &argv);
#endif

  HPCG_Params params;

  HPCG_Init(&argc, &argv, params);

  // Check if QuickPath option is enabled.
  // If the running time is set to zero, we minimize all paths through the program
  bool quickPath = (params.runningTime==0);

  int size = params.comm_size, rank = params.comm_rank; // Number of MPI processes, My process ID

#ifdef HPCG_DETAILED_DEBUG
  if (size < 100 && rank==0) HPCG_fout << "Process "<<rank<<" of "<<size<<" is alive with " << params.numThreads << " threads." <<endl;

  if (rank==0) {
    char c;
    std::cout << "Press key to continue"<< std::endl;
    std::cin.get(c);
  }
#ifndef HPCG_NO_MPI
  MPI_Barrier(MPI_COMM_WORLD);
#endif
#endif

  local_int_t nx,ny,nz;
  nx = (local_int_t)params.nx;
  ny = (local_int_t)params.ny;
  nz = (local_int_t)params.nz;
  int ierr = 0;  // Used to check return codes on function calls

  ierr = CheckAspectRatio(0.125, nx, ny, nz, "local problem", rank==0);
  if (ierr)
    return ierr;

  /////////////////////////
  // Problem setup Phase //
  /////////////////////////

#ifdef HPCG_DEBUG
  double t1 = mytimer();
#endif

  // Construct the geometry and linear system
  Geometry * geom = new Geometry;
  GenerateGeometry(size, rank, params.numThreads, params.pz, params.zl, params.zu, nx, ny, nz, params.npx, params.npy, params.npz, geom);

  ierr = CheckAspectRatio(0.125, geom->npx, geom->npy, geom->npz, "process grid", rank==0);
  if (ierr)
    return ierr;

  // Use this array for collecting timing information
  std::vector< double > times(10,0.0);

  double setup_time = mytimer();

  SparseMatrix A;
  InitializeSparseMatrix(A, geom);

  Vector b, x, xexact;
  GenerateProblem(A, &b, &x, &xexact);
  SetupHalo(A);
  int numberOfMgLevels = 4; // Number of levels including first
  SparseMatrix * curLevelMatrix = &A;
  for (int level = 1; level< numberOfMgLevels; ++level) {
    GenerateCoarseProblem(*curLevelMatrix);
    curLevelMatrix = curLevelMatrix->Ac; // Make the just-constructed coarse grid the next level
  }

  setup_time = mytimer() - setup_time; // Capture total time of setup
  times[9] = setup_time; // Save it for reporting

  curLevelMatrix = &A;
  Vector * curb = &b;
  Vector * curx = &x;
  Vector * curxexact = &xexact;
  for (int level = 0; level< numberOfMgLevels; ++level) {
     CheckProblem(*curLevelMatrix, curb, curx, curxexact);
     curLevelMatrix = curLevelMatrix->Ac; // Make the nextcoarse grid the next level
     curb = 0; // No vectors after the top level
     curx = 0;
     curxexact = 0;
  }


  CGData data;
  InitializeSparseCGData(A, data);



  ////////////////////////////////////
  // Reference SpMV+MG Timing Phase //
  ////////////////////////////////////

  // Call Reference SpMV and MG. Compute Optimization time as ratio of times in these routines

  local_int_t nrow = A.localNumberOfRows;
  local_int_t ncol = A.localNumberOfColumns;

  Vector x_overlap, b_computed;
  InitializeVector(x_overlap, ncol); // Overlapped copy of x vector
  InitializeVector(b_computed, nrow); // Computed RHS vector


  // Record execution time of reference SpMV and MG kernels for reporting times
  // First load vector with random values
  FillRandomVector(x_overlap);

  int numberOfCalls = 10;
  if (quickPath) numberOfCalls = 1; //QuickPath means we do on one call of each block of repetitive code
  double t_begin = mytimer();
  for (int i=0; i< numberOfCalls; ++i) {
    ierr = ComputeSPMV_ref(A, x_overlap, b_computed); // b_computed = A*x_overlap
    if (ierr) HPCG_fout << "Error in call to SpMV: " << ierr << ".\n" << endl;
    ierr = ComputeMG_ref(A, b_computed, x_overlap); // b_computed = Minv*y_overlap
    if (ierr) HPCG_fout << "Error in call to MG: " << ierr << ".\n" << endl;
  }
  times[8] = (mytimer() - t_begin)/((double) numberOfCalls);  // Total time divided by number of calls.
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total SpMV+MG timing phase execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

  ///////////////////////////////
  // Reference CG Timing Phase //
  ///////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  int global_failure = 0; // assume all is well: no failures

  int niters = 0;
  int totalNiters_ref = 0;
  double normr = 0.0;
  double normr0 = 0.0;
  int refMaxIters = 50;
  numberOfCalls = 1; // Only need to run the residual reduction analysis once

  // Compute the residual reduction for the natural ordering and reference kernels
  std::vector< double > ref_times(9,0.0);
  double tolerance = 0.0; // Set tolerance to zero to make all runs do maxIters iterations
  int err_count = 0;
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x);
    ierr = CG_ref( A, data, b, x, refMaxIters, tolerance, niters, normr, normr0, &ref_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    totalNiters_ref += niters;
  }
  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to reference CG." << endl;
  double refTolerance = normr / normr0;

  // Call user-tunable set up function.
  double t7 = mytimer();
  OptimizeProblem(A, data, b, x, xexact);
  t7 = mytimer() - t7;
  times[7] = t7;
#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total problem setup time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DETAILED_DEBUG
  if (geom->size == 1) WriteProblem(*geom, A, b, x, xexact);
#endif


  //////////////////////////////
  // Validation Testing Phase //
  //////////////////////////////

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif
  TestCGData testcg_data;
  testcg_data.count_pass = testcg_data.count_fail = 0;
  TestCG(A, data, b, x, testcg_data);

  TestSymmetryData testsymmetry_data;
  TestSymmetry(A, b, xexact, testsymmetry_data);

#ifdef HPCG_DEBUG
  if (rank==0) HPCG_fout << "Total validation (TestCG and TestSymmetry) execution time in main (sec) = " << mytimer() - t1 << endl;
#endif

#ifdef HPCG_DEBUG
  t1 = mytimer();
#endif

  //////////////////////////////
  // Optimized CG Setup Phase //
  //////////////////////////////

  niters = 0;
  normr = 0.0;
  normr0 = 0.0;
  err_count = 0;
  int tolerance_failures = 0;

  int optMaxIters = 10*refMaxIters;
  int optNiters = refMaxIters;
  double opt_worst_time = 0.0;

  std::vector< double > opt_times(9,0.0);

  // Compute the residual reduction and residual count for the user ordering and optimized kernels.
  for (int i=0; i< numberOfCalls; ++i) {
    ZeroVector(x); // start x at all zeros
    double last_cummulative_time = opt_times[0];
    ierr = CG( A, data, b, x, optMaxIters, refTolerance, niters, normr, normr0, &opt_times[0], true);
    if (ierr) ++err_count; // count the number of errors in CG
    // Convergence check accepts an error of no more than 6 significant digits of relTolerance
    if (normr / normr0 > refTolerance * (1.0 + 1.0e-6)) ++tolerance_failures; // the number of failures to reduce residual

    // pick the largest number of iterations to guarantee convergence
    if (niters > optNiters) optNiters = niters;

    double current_time = opt_times[0] - last_cummulative_time;
    if (current_time > opt_worst_time) opt_worst_time = current_time;
  }

#ifndef HPCG_NO_MPI
// Get the absolute worst time across all MPI ranks (time in CG can be different)
  double local_opt_worst_time = opt_worst_time;
  MPI_Allreduce(&local_opt_worst_time, &opt_worst_time, 1, MPI_DOUBLE, MPI_MAX, MPI_COMM_WORLD);
#endif


  if (rank == 0 && err_count) HPCG_fout << err_count << " error(s) in call(s) to optimized CG." << endl;
  if (tolerance_failures) {
    global_failure = 1;
    if (rank == 0)
      HPCG_fout << "Failed to reduce the residual " << tolerance_failures << " times." << endl;
  }

  ///////////////////////////////
  // Optimized CG Timing Phase //
  ///////////////////////////////

  // Here we finally run the benchmark phase
  // The variable total_runtime is the target benchmark execution time in seconds

  double total_runtime = params.runningTime;
  int numberOfCgSets = int(total_runtime / opt_worst_time) + 1; // Run at least once, account for rounding

#ifdef HPCG_DEBUG
  if (rank==0) {
    HPCG_fout << "Projected running time: " << total_runtime << " seconds" << endl;
    HPCG_fout << "Number of CG sets: " << numberOfCgSets << endl;
  }
#endif

  /* This is the timed run for a specified amount of time. */

  optMaxIters = optNiters;
  double optTolerance = 0.0;  // Force optMaxIters iterations
  TestNormsData testnorms_data;
  testnorms_data.samples = numberOfCgSets;
  testnorms_data.values = new double[numberOfCgSets];

  for (int i=0; i< numberOfCgSets; ++i) {
    ZeroVector(x); // Zero out x
    ierr = CG( A, data, b, x, optMaxIters, optTolerance, niters, normr, normr0, &times[0], true);
    if (ierr) HPCG_fout << "Error in call to CG: " << ierr << ".\n" << endl;
    if (rank==0) HPCG_fout << "Call [" << i << "] Scaled Residual [" << normr/normr0 << "]" << endl;
    testnorms_data.values[i] = normr/normr0; // Record scaled residual from this run
  }

  // Compute difference between known exact solution and computed solution
  // All processors are needed here.
#ifdef HPCG_DEBUG
  double residual = 0;
  ierr = ComputeResidual(A.localNumberOfRows, x, xexact, residual);
  if (ierr) HPCG_fout << "Error in call to compute_residual: " << ierr << ".\n" << endl;
  if (rank==0) HPCG_fout << "Difference between computed and exact  = " << residual << ".\n" << endl;
#endif

  // Test Norm Results
  ierr = TestNorms(testnorms_data);

  ////////////////////
  // Report Results //
  ////////////////////

  // Report results to YAML file
  ReportResults(A, numberOfMgLevels, numberOfCgSets, refMaxIters, optMaxIters, &times[0], testcg_data, testsymmetry_data, testnorms_data, global_failure, quickPath);

  // Clean up
  DeleteMatrix(A); // This delete will recursively delete all coarse grid data
  DeleteCGData(data);
  DeleteVector(x);
  DeleteVector(b);
  DeleteVector(xexact);
  DeleteVector(x_overlap);
  DeleteVector(b_computed);
  delete [] testnorms_data.values;



  HPCG_Finalize();

  // Finish up
#ifndef HPCG_NO_MPI
  MPI_Finalize();
#endif
  return 0;
}